

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

RUNE_DATA * new_rune(void)

{
  RUNE_DATA *rune;
  RUNE_DATA *local_8;
  
  if (rune_free == (RUNE_DATA *)0x0) {
    local_8 = (RUNE_DATA *)operator_new(0x50);
  }
  else {
    local_8 = rune_free;
    rune_free = rune_free->next;
  }
  memcpy(local_8,&new_rune::rune_zero,0x50);
  return local_8;
}

Assistant:

RUNE_DATA *new_rune(void)
{
	static RUNE_DATA rune_zero;
	RUNE_DATA *rune;

	if (rune_free == nullptr)
	{
		rune = new RUNE_DATA;
	}
	else
	{
		rune = rune_free;
		rune_free = rune->next;
	}

	*rune = rune_zero;
	return rune;
}